

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

void __thiscall f8n::runtime::MessageQueue::Unregister(MessageQueue *this,IMessageTarget *target)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<f8n::runtime::IMessageTarget_*>,_std::_Rb_tree_iterator<f8n::runtime::IMessageTarget_*>_>
  pVar4;
  LockT lock;
  IMessageTarget *local_28;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->queueMutex;
  local_20._M_owns = false;
  local_28 = target;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  p_Var1 = &(this->targets)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(IMessageTarget **)(p_Var3 + 1) < local_28]) {
    if (*(IMessageTarget **)(p_Var3 + 1) >= local_28) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var3 = p_Var2, local_28 < *(IMessageTarget **)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  else {
    pVar4 = std::
            _Rb_tree<f8n::runtime::IMessageTarget_*,_f8n::runtime::IMessageTarget_*,_std::_Identity<f8n::runtime::IMessageTarget_*>,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
            ::equal_range(&(this->targets)._M_t,&local_28);
    std::
    _Rb_tree<f8n::runtime::IMessageTarget_*,_f8n::runtime::IMessageTarget_*,_std::_Identity<f8n::runtime::IMessageTarget_*>,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
    ::_M_erase_aux(&(this->targets)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    (*(this->super_IMessageQueue)._vptr_IMessageQueue[3])(this,local_28,0xffffffff);
  }
  return;
}

Assistant:

void MessageQueue::Unregister(IMessageTarget* target) {
    bool shouldRemove = false;
    {
        LockT lock(this->queueMutex);
        if (this->targets.find(target) != this->targets.end()) {
            this->targets.erase(target);
            shouldRemove = true;
        }
    }
    if (shouldRemove) {
        this->Remove(target);
    }
}